

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FadeEffect_test.cpp
# Opt level: O0

void __thiscall fade_effect_converge_Test::TestBody(fade_effect_converge_Test *this)

{
  bool bVar1;
  char *message;
  float local_ac;
  AssertHelper local_a8;
  Message local_a0 [3];
  uchar local_81;
  undefined1 local_80 [8];
  AssertionResult gtest_ar;
  byte local_68 [4];
  int i;
  ConvergeExpecation ces [6];
  float r;
  fade_effect_converge_Test *this_local;
  
  local_68[0] = 0x50;
  local_68[1] = 0x5a;
  i = 0x3f000000;
  ces[0].x = 'U';
  ces[0].ratio._0_1_ = 0;
  ces[0].ratio._1_1_ = 0xff;
  ces[0].result = '\0';
  ces[0]._9_3_ = 0x3f0000;
  ces[1].x = '\x7f';
  ces[1].ratio._0_1_ = 0x32;
  ces[1].ratio._1_1_ = 0x14;
  ces[1].result = 0x9a;
  ces[1]._9_3_ = 0x3e9999;
  ces[2].x = ')';
  ces[2].ratio._0_1_ = 0x20;
  ces[2].ratio._1_1_ = 0x10;
  ces[2].result = '\0';
  ces[2]._9_3_ = 0x3f0000;
  ces[3].x = '\x18';
  ces[3].ratio._0_1_ = 0x30;
  ces[3].ratio._1_1_ = 0;
  ces[3].result = '\0';
  ces[3]._9_3_ = 0x3f0000;
  ces[4].x = '\x18';
  ces[4].ratio._0_1_ = 0xff;
  ces[4].ratio._1_1_ = 0xe0;
  ces[4].result = '\0';
  ces[4]._9_3_ = 0x3f0000;
  ces[5].x = 0xef;
  for (gtest_ar.message_.ptr_._4_4_ = 0; gtest_ar.message_.ptr_._4_4_ < 6;
      gtest_ar.message_.ptr_._4_4_ = gtest_ar.message_.ptr_._4_4_ + 1) {
    if (local_68[(long)(int)gtest_ar.message_.ptr_._4_4_ * 0xc + 1] <
        local_68[(long)(int)gtest_ar.message_.ptr_._4_4_ * 0xc]) {
      local_ac = -*(float *)&ces[(long)(int)gtest_ar.message_.ptr_._4_4_ + -1].result *
                 (float)(int)((uint)local_68[(long)(int)gtest_ar.message_.ptr_._4_4_ * 0xc] -
                             (uint)local_68[(long)(int)gtest_ar.message_.ptr_._4_4_ * 0xc + 1]) +
                 (float)local_68[(long)(int)gtest_ar.message_.ptr_._4_4_ * 0xc];
    }
    else {
      local_ac = *(float *)&ces[(long)(int)gtest_ar.message_.ptr_._4_4_ + -1].result *
                 (float)(int)((uint)local_68[(long)(int)gtest_ar.message_.ptr_._4_4_ * 0xc + 1] -
                             (uint)local_68[(long)(int)gtest_ar.message_.ptr_._4_4_ * 0xc]) +
                 (float)local_68[(long)(int)gtest_ar.message_.ptr_._4_4_ * 0xc];
    }
    local_81 = (uchar)(int)local_ac;
    testing::internal::EqHelper<false>::Compare<unsigned_char,unsigned_char>
              ((EqHelper<false> *)local_80,
               "(color_t)(ces[i].y >= ces[i].x ? ces[i].x + ces[i].ratio * (ces[i].y - ces[i].x) : ces[i].x - ces[i].ratio * (ces[i].x - ces[i].y) )"
               ,"ces[i].result",&local_81,&ces[(int)gtest_ar.message_.ptr_._4_4_].x);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
    if (!bVar1) {
      testing::Message::Message(local_a0);
      message = testing::AssertionResult::failure_message((AssertionResult *)local_80);
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/kigster[P]librgb/test/src/FadeEffect_test.cpp"
                 ,0x2c,message);
      testing::internal::AssertHelper::operator=(&local_a8,local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_a8);
      testing::Message::~Message(local_a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  }
  return;
}

Assistant:

TEST(fade_effect, converge) {
    float r = 0.5;
    ConvergeExpecation ces[] = {
            {80,   90,   0.5, 85},
            {0,    255,  0.5, 127},
            {50,   20,   0.3, 41},
            {0x20, 0x10, r,   (color_t) (0x20 - r * (0x20 - 0x10))},
            {0x30, 0x00, r,   (color_t) (0x30 - r * (0x30 - 0x00))},
            {0xFF, 0xE0, r,   (color_t) (0xFF - r * (0xFF - 0xE0))},
    };

    for (int i = 0; i < sizeof(ces) / sizeof(ConvergeExpecation); i++) {
        EXPECT_CONVERGENCE(ces[i]);
    }
}